

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<kj::HttpClient::ConnectRequest::Status,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::ConnectRequest::Status>_>
::fulfill(AdapterPromiseNode<kj::HttpClient::ConnectRequest::Status,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::ConnectRequest::Status>_>
          *this,Status *value)

{
  ExceptionOr<kj::HttpClient::ConnectRequest::Status> local_1f0;
  
  if (this->waiting == true) {
    this->waiting = false;
    ExceptionOr<kj::HttpClient::ConnectRequest::Status>::ExceptionOr(&local_1f0,value);
    ExceptionOr<kj::HttpClient::ConnectRequest::Status>::operator=(&this->result,&local_1f0);
    ExceptionOr<kj::HttpClient::ConnectRequest::Status>::~ExceptionOr(&local_1f0);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }